

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O2

bool __thiscall
cmParseArgumentsCommand::InitialPass
          (cmParseArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  mapped_type *this_01;
  _Base_ptr p_Var13;
  string *this_02;
  string *iter;
  pointer pbVar14;
  insideValues currentState;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unsigned_long uVar15;
  pointer pbVar16;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  string argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  unsigned_long argvStart;
  int multiArgumentsFound;
  string prefix;
  options_map options;
  char *arg;
  unsigned_long count;
  multi_map multiValArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string dup_warning;
  single_map singleValArgs;
  string currentArgName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_keywords;
  options_set keywordsMissingValues;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar1 - (long)__lhs;
  if (uVar5 < 0x61) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&keywordsMissingValues,"must be called with at least 4 arguments.",
               (allocator<char> *)&options);
    cmCommand::SetError(&this->super_cmCommand,(string *)&keywordsMissingValues);
    psVar6 = (string *)&keywordsMissingValues;
  }
  else {
    argvStart = 0;
    bVar3 = std::operator==(__lhs,"PARSE_ARGV");
    if (bVar3) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0xc0) {
        bVar4 = cmSystemTools::StringToULong(__lhs[1]._M_dataplus._M_p,&argvStart);
        if (bVar4) {
          __lhs = __lhs + 2;
          goto LAB_001a9335;
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options
                       ,"PARSE_ARGV index \'",__lhs + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &keywordsMissingValues,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options
                       ,"\' is not an unsigned integer");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&keywordsMissingValues);
        std::__cxx11::string::~string((string *)&keywordsMissingValues);
        this_02 = (string *)&options;
      }
      else {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&keywordsMissingValues,
                   "PARSE_ARGV must be called with exactly 6 arguments.",(allocator<char> *)&options
                  );
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&keywordsMissingValues);
        this_02 = (string *)&keywordsMissingValues;
      }
      std::__cxx11::string::~string(this_02);
      cmSystemTools::s_FatalErrorOccured = true;
      goto LAB_001a9eb6;
    }
LAB_001a9335:
    std::operator+(&prefix,__lhs,"_");
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &options._M_t._M_impl.super__Rb_tree_header._M_header;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    used_keywords._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &used_keywords._M_t._M_impl.super__Rb_tree_header._M_header;
    used_keywords._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    used_keywords._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    used_keywords._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    used_keywords._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         used_keywords._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dup_warning,"keyword defined more than once: ",
               (allocator<char> *)&keywordsMissingValues);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(__lhs + 1,&list,false);
    pbVar16 = list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_350 = __lhs + 2;
    for (pbVar14 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar16;
        pbVar14 = pbVar14 + 1) {
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&used_keywords,pbVar14);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &keywordsMissingValues,&dup_warning,pbVar14);
        cmMakefile::IssueMessage
                  (pcVar2,WARNING,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &keywordsMissingValues);
        std::__cxx11::string::~string((string *)&keywordsMissingValues);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::operator[](&options,pbVar14);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    cmSystemTools::ExpandListArgument(local_350,&list,false);
    pbVar16 = list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_350 = __lhs + 3;
    for (pbVar14 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar16;
        pbVar14 = pbVar14 + 1) {
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&used_keywords,pbVar14);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &keywordsMissingValues,&dup_warning,pbVar14);
        cmMakefile::IssueMessage
                  (pcVar2,WARNING,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &keywordsMissingValues);
        std::__cxx11::string::~string((string *)&keywordsMissingValues);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&singleValArgs,pbVar14);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    cmSystemTools::ExpandListArgument(local_350,&list,false);
    pbVar16 = list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar6 = __lhs + 4;
    for (pbVar14 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar16;
        pbVar14 = pbVar14 + 1) {
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&used_keywords,pbVar14);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &keywordsMissingValues,&dup_warning,pbVar14);
        cmMakefile::IssueMessage
                  (pcVar2,WARNING,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &keywordsMissingValues);
        std::__cxx11::string::~string((string *)&keywordsMissingValues);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator[](&multiValArgs,pbVar14);
    }
    currentArgName._M_dataplus._M_p = (pointer)&currentArgName.field_2;
    currentArgName._M_string_length = 0;
    currentArgName.field_2._M_local_buf[0] = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    if (bVar3) {
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&keywordsMissingValues,"ARGC",(allocator<char> *)&local_370);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&keywordsMissingValues);
      std::__cxx11::string::string((string *)&argc,(string *)psVar6);
      std::__cxx11::string::~string((string *)&keywordsMissingValues);
      bVar4 = cmSystemTools::StringToULong(argc._M_dataplus._M_p,&count);
      if (bVar4) {
        uVar15 = argvStart;
        do {
          if (count <= uVar15) {
            std::__cxx11::string::~string((string *)&argc);
            goto LAB_001a9932;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&keywordsMissingValues);
          poVar7 = std::operator<<((ostream *)&keywordsMissingValues,"ARGV");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          arg = pcVar8;
          if (pcVar8 == (char *)0x0) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            std::operator+(&local_268,"PARSE_ARGV called with ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &multiArgumentsFound);
            std::operator+(&local_370,&local_268," not set");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_370);
            std::__cxx11::string::~string((string *)&local_370);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&multiArgumentsFound);
            cmSystemTools::s_FatalErrorOccured = true;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                       &arg);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&keywordsMissingValues);
          uVar15 = uVar15 + 1;
        } while (pcVar8 != (char *)0x0);
      }
      else {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+(&local_370,"PARSE_ARGV called with ARGC=\'",&argc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &keywordsMissingValues,&local_370,"\' that is not an unsigned integer");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&keywordsMissingValues);
        std::__cxx11::string::~string((string *)&keywordsMissingValues);
        std::__cxx11::string::~string((string *)&local_370);
        cmSystemTools::s_FatalErrorOccured = true;
      }
      std::__cxx11::string::~string((string *)&argc);
    }
    else {
      for (; psVar6 != pbVar1; psVar6 = psVar6 + 1) {
        cmSystemTools::ExpandListArgument(psVar6,&list,false);
      }
LAB_001a9932:
      pbVar1 = list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header;
      keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      multiArgumentsFound = 0;
      currentState = NONE;
      keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pbVar16 = list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar1;
          pbVar16 = pbVar16 + 1) {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::find(&options._M_t,pbVar16);
        if ((_Rb_tree_header *)iVar9._M_node == &options._M_t._M_impl.super__Rb_tree_header) {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&singleValArgs._M_t,pbVar16);
          if ((_Rb_tree_header *)iVar10._M_node == &singleValArgs._M_t._M_impl.super__Rb_tree_header
             ) {
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&multiValArgs._M_t,pbVar16);
            if ((_Rb_tree_header *)iVar11._M_node ==
                &multiValArgs._M_t._M_impl.super__Rb_tree_header) {
              if (currentState == MULTI) {
                multiArgumentsFound = multiArgumentsFound + 1;
                if (bVar3) {
                  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[](&multiValArgs,&currentArgName);
                  EscapeArg(&argc,pbVar16);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(this_00,&argc);
                  std::__cxx11::string::~string((string *)&argc);
                  currentState = MULTI;
                }
                else {
                  this_01 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[](&multiValArgs,&currentArgName);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(this_01,pbVar16);
                  currentState = MULTI;
                }
              }
              else if (currentState == SINGLE) {
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&singleValArgs,&currentArgName);
                currentState = NONE;
                std::__cxx11::string::_M_assign((string *)pmVar12);
              }
              else {
                multiArgumentsFound = 0;
                if (bVar3) {
                  EscapeArg(&argc,pbVar16);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &unparsed,&argc);
                  std::__cxx11::string::~string((string *)&argc);
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&unparsed,pbVar16);
                }
              }
            }
            else {
              DetectKeywordsMissingValues
                        (currentState,&currentArgName,&multiArgumentsFound,&keywordsMissingValues);
              std::__cxx11::string::_M_assign((string *)&currentArgName);
              currentState = MULTI;
            }
          }
          else {
            DetectKeywordsMissingValues
                      (currentState,&currentArgName,&multiArgumentsFound,&keywordsMissingValues);
            std::__cxx11::string::_M_assign((string *)&currentArgName);
            currentState = SINGLE;
          }
        }
        else {
          DetectKeywordsMissingValues
                    (currentState,&currentArgName,&multiArgumentsFound,&keywordsMissingValues);
          *(undefined1 *)&iVar9._M_node[2]._M_color = _S_black;
          currentState = NONE;
        }
      }
      DetectKeywordsMissingValues
                (currentState,&currentArgName,&multiArgumentsFound,&keywordsMissingValues);
      pcVar2 = (this->super_cmCommand).Makefile;
      for (p_Var13 = options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &options._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        std::operator+(&argc,&prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var13 + 1));
        pcVar8 = "FALSE";
        if ((char)p_Var13[2]._M_color != _S_red) {
          pcVar8 = "TRUE";
        }
        cmMakefile::AddDefinition(pcVar2,&argc,pcVar8);
        std::__cxx11::string::~string((string *)&argc);
      }
      for (p_Var13 = singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &singleValArgs._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        if (p_Var13[2]._M_parent == (_Base_ptr)0x0) {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1));
          cmMakefile::RemoveDefinition(pcVar2,&argc);
        }
        else {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1));
          cmMakefile::AddDefinition(pcVar2,&argc,*(char **)(p_Var13 + 2));
        }
        std::__cxx11::string::~string((string *)&argc);
      }
      for (p_Var13 = multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &multiValArgs._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        if (*(_Base_ptr *)(p_Var13 + 2) == p_Var13[2]._M_parent) {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1));
          cmMakefile::RemoveDefinition(pcVar2,&argc);
        }
        else {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1));
          local_268._M_dataplus._M_p = *(pointer *)(p_Var13 + 2);
          local_268._M_string_length = (size_type)p_Var13[2]._M_parent;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    (&local_370,
                     (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_268,";");
          cmMakefile::AddDefinition(pcVar2,&argc,local_370._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_370);
        }
        std::__cxx11::string::~string((string *)&argc);
      }
      if (unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&argc,&prefix,"UNPARSED_ARGUMENTS");
        cmMakefile::RemoveDefinition(pcVar2,&argc);
      }
      else {
        std::operator+(&argc,&prefix,"UNPARSED_ARGUMENTS");
        local_268._M_dataplus._M_p =
             (pointer)unparsed.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_268._M_string_length =
             (size_type)
             unparsed.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&local_370,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&local_268,";");
        cmMakefile::AddDefinition(pcVar2,&argc,local_370._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_370);
      }
      std::__cxx11::string::~string((string *)&argc);
      if (keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::operator+(&argc,&prefix,"KEYWORDS_MISSING_VALUES");
        cmMakefile::RemoveDefinition(pcVar2,&argc);
      }
      else {
        std::operator+(&argc,&prefix,"KEYWORDS_MISSING_VALUES");
        local_268._M_dataplus._M_p =
             (pointer)keywordsMissingValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_268._M_string_length =
             (size_type)&keywordsMissingValues._M_t._M_impl.super__Rb_tree_header;
        cmJoin<cmRange<std::_Rb_tree_const_iterator<std::__cxx11::string>>>
                  (&local_370,
                   (cmRange<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268,";");
        cmMakefile::AddDefinition(pcVar2,&argc,local_370._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_370);
      }
      std::__cxx11::string::~string((string *)&argc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&keywordsMissingValues._M_t);
    }
    std::__cxx11::string::~string((string *)&currentArgName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list);
    std::__cxx11::string::~string((string *)&dup_warning);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&used_keywords._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&unparsed);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&multiValArgs._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&singleValArgs._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree(&options._M_t);
    psVar6 = &prefix;
  }
  std::__cxx11::string::~string((string *)psVar6);
LAB_001a9eb6:
  return 0x60 < uVar5;
}

Assistant:

bool cmParseArgumentsCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  // cmake_parse_arguments(prefix options single multi <ARGN>)
  //                         1       2      3      4
  // or
  // cmake_parse_arguments(PARSE_ARGV N prefix options single multi)
  if (args.size() < 4) {
    this->SetError("must be called with at least 4 arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator argIter = args.begin(),
                                           argEnd = args.end();
  bool parseFromArgV = false;
  unsigned long argvStart = 0;
  if (*argIter == "PARSE_ARGV") {
    if (args.size() != 6) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "PARSE_ARGV must be called with exactly 6 arguments.");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    parseFromArgV = true;
    argIter++; // move past PARSE_ARGV
    if (!cmSystemTools::StringToULong(argIter->c_str(), &argvStart)) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   "PARSE_ARGV index '" + *argIter +
                                     "' is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    argIter++; // move past N
  }
  // the first argument is the prefix
  const std::string prefix = (*argIter++) + "_";

  // define the result maps holding key/value pairs for
  // options, single values and multi values
  options_map options;
  single_map singleValArgs;
  multi_map multiValArgs;

  // anything else is put into a vector of unparsed strings
  std::vector<std::string> unparsed;

  // remember already defined keywords
  std::set<std::string> used_keywords;
  const std::string dup_warning = "keyword defined more than once: ";

  // the second argument is a (cmake) list of options without argument
  std::vector<std::string> list;
  cmSystemTools::ExpandListArgument(*argIter++, list);
  for (std::string const& iter : list) {
    if (!used_keywords.insert(iter).second) {
      this->GetMakefile()->IssueMessage(MessageType::WARNING,
                                        dup_warning + iter);
    }
    options[iter]; // default initialize
  }

  // the third argument is a (cmake) list of single argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  for (std::string const& iter : list) {
    if (!used_keywords.insert(iter).second) {
      this->GetMakefile()->IssueMessage(MessageType::WARNING,
                                        dup_warning + iter);
    }
    singleValArgs[iter]; // default initialize
  }

  // the fourth argument is a (cmake) list of multi argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  for (std::string const& iter : list) {
    if (!used_keywords.insert(iter).second) {
      this->GetMakefile()->IssueMessage(MessageType::WARNING,
                                        dup_warning + iter);
    }
    multiValArgs[iter]; // default initialize
  }

  insideValues insideValues = NONE;
  std::string currentArgName;

  list.clear();
  if (!parseFromArgV) {
    // Flatten ;-lists in the arguments into a single list as was done
    // by the original function(CMAKE_PARSE_ARGUMENTS).
    for (; argIter != argEnd; ++argIter) {
      cmSystemTools::ExpandListArgument(*argIter, list);
    }
  } else {
    // in the PARSE_ARGV move read the arguments from ARGC and ARGV#
    std::string argc = this->Makefile->GetSafeDefinition("ARGC");
    unsigned long count;
    if (!cmSystemTools::StringToULong(argc.c_str(), &count)) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   "PARSE_ARGV called with ARGC='" + argc +
                                     "' that is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    for (unsigned long i = argvStart; i < count; ++i) {
      std::ostringstream argName;
      argName << "ARGV" << i;
      const char* arg = this->Makefile->GetDefinition(argName.str());
      if (!arg) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "PARSE_ARGV called with " +
                                       argName.str() + " not set");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      list.emplace_back(arg);
    }
  }

  options_set keywordsMissingValues;
  int multiArgumentsFound = 0;

  // iterate over the arguments list and fill in the values where applicable
  for (std::string const& arg : list) {
    const options_map::iterator optIter = options.find(arg);
    if (optIter != options.end()) {
      DetectKeywordsMissingValues(insideValues, currentArgName,
                                  multiArgumentsFound, keywordsMissingValues);
      insideValues = NONE;
      optIter->second = true;
      continue;
    }

    const single_map::iterator singleIter = singleValArgs.find(arg);
    if (singleIter != singleValArgs.end()) {
      DetectKeywordsMissingValues(insideValues, currentArgName,
                                  multiArgumentsFound, keywordsMissingValues);
      insideValues = SINGLE;
      currentArgName = arg;
      continue;
    }

    const multi_map::iterator multiIter = multiValArgs.find(arg);
    if (multiIter != multiValArgs.end()) {
      DetectKeywordsMissingValues(insideValues, currentArgName,
                                  multiArgumentsFound, keywordsMissingValues);
      insideValues = MULTI;
      currentArgName = arg;
      continue;
    }

    switch (insideValues) {
      case SINGLE:
        singleValArgs[currentArgName] = arg;
        insideValues = NONE;
        break;
      case MULTI:
        ++multiArgumentsFound;
        if (parseFromArgV) {
          multiValArgs[currentArgName].push_back(EscapeArg(arg));
        } else {
          multiValArgs[currentArgName].push_back(arg);
        }
        break;
      default:
        multiArgumentsFound = 0;

        if (parseFromArgV) {
          unparsed.push_back(EscapeArg(arg));
        } else {
          unparsed.push_back(arg);
        }
        break;
    }
  }

  DetectKeywordsMissingValues(insideValues, currentArgName,
                              multiArgumentsFound, keywordsMissingValues);

  PassParsedArguments(prefix, *this->Makefile, options, singleValArgs,
                      multiValArgs, unparsed, keywordsMissingValues);

  return true;
}